

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.c
# Opt level: O2

int parg_getopt_long(parg_state *ps,int argc,char **argv,char *optstring,parg_option *longopts,
                    int *longindex)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  size_t __n;
  char cVar6;
  parg_option *ppVar7;
  char *pcVar8;
  int local_5c;
  int local_58;
  
  if (ps == (parg_state *)0x0) {
    __assert_fail("ps != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/aras-p[P]sizer/src/parg.c",0xa2
                  ,
                  "int parg_getopt_long(struct parg_state *, int, char *const *, const char *, const struct parg_option *, int *)"
                 );
  }
  if (argv == (char **)0x0) {
    __assert_fail("argv != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/aras-p[P]sizer/src/parg.c",0xa3
                  ,
                  "int parg_getopt_long(struct parg_state *, int, char *const *, const char *, const struct parg_option *, int *)"
                 );
  }
  if (optstring == (char *)0x0) {
    __assert_fail("optstring != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/aras-p[P]sizer/src/parg.c",0xa4
                  ,
                  "int parg_getopt_long(struct parg_state *, int, char *const *, const char *, const struct parg_option *, int *)"
                 );
  }
  ps->optarg = (char *)0x0;
  if (argc < 2) {
    return -1;
  }
  pcVar8 = ps->nextchar;
  if ((pcVar8 == (char *)0x0) || (cVar6 = *pcVar8, cVar6 == '\0')) {
    iVar3 = ps->optind;
    if (argc <= iVar3) {
      return -1;
    }
    pcVar8 = argv[iVar3];
    if (pcVar8 == (char *)0x0) {
      return -1;
    }
    ps->optind = iVar3 + 1;
    ps->nextchar = pcVar8;
    if (*pcVar8 != '-') {
LAB_00107504:
      ps->optarg = pcVar8;
      ps->nextchar = (char *)0x0;
      return 1;
    }
    if (pcVar8[1] == '-') {
      if (pcVar8[2] == '\0') {
        ps->nextchar = (char *)0x0;
        return -1;
      }
      if (longopts != (parg_option *)0x0) {
        pcVar8 = pcVar8 + 2;
        ps->nextchar = pcVar8;
        __n = strcspn(pcVar8,"=");
        local_5c = -1;
        iVar3 = 0;
        local_58 = 0;
        for (ppVar7 = longopts; pcVar5 = ppVar7->name, pcVar5 != (char *)0x0; ppVar7 = ppVar7 + 1) {
          iVar4 = strncmp(pcVar8,pcVar5,__n);
          if (iVar4 == 0) {
            if (pcVar5[__n] == '\0') goto LAB_001076a7;
            local_58 = local_58 + 1;
            local_5c = iVar3;
          }
          iVar3 = iVar3 + 1;
        }
        if (local_58 != 1) {
          ps->optopt = 0;
          ps->nextchar = (char *)0x0;
          return 0x3f;
        }
        iVar3 = local_5c;
        if (local_5c == -1) {
          __assert_fail("match != -1",
                        "/workspace/llm4binary/github/license_c_cmakelists/aras-p[P]sizer/src/parg.c"
                        ,0x67,
                        "int match_long(struct parg_state *, int, char *const *, const char *, const struct parg_option *, int *)"
                       );
        }
LAB_001076a7:
        if (longindex != (int *)0x0) {
          *longindex = iVar3;
        }
        if (pcVar8[__n] == '=') {
          if (longopts[iVar3].has_arg == 0) {
LAB_0010770e:
            iVar4 = 0;
            if (longopts[iVar3].flag == (int *)0x0) {
              iVar4 = longopts[iVar3].val;
            }
            ps->optopt = iVar4;
            ps->nextchar = (char *)0x0;
            goto LAB_0010763f;
          }
          pcVar8 = pcVar8 + __n + 1;
        }
        else {
          if (longopts[iVar3].has_arg != 1) goto LAB_001076f0;
          iVar4 = ps->optind;
          if ((argc <= iVar4) || (pcVar8 = argv[iVar4], pcVar8 == (char *)0x0)) goto LAB_0010770e;
          ps->optind = iVar4 + 1;
        }
        ps->optarg = pcVar8;
LAB_001076f0:
        ps->nextchar = (char *)0x0;
        if (longopts[iVar3].flag != (int *)0x0) {
          *longopts[iVar3].flag = longopts[iVar3].val;
          return 0;
        }
        return longopts[iVar3].val;
      }
    }
    else if (pcVar8[1] == '\0') goto LAB_00107504;
    pcVar8 = pcVar8 + 1;
    ps->nextchar = pcVar8;
    cVar6 = *pcVar8;
  }
  pcVar5 = strchr(optstring,(int)cVar6);
  if (pcVar5 == (char *)0x0) {
    ps->nextchar = pcVar8 + 1;
    ps->optopt = (int)*pcVar8;
    return 0x3f;
  }
  pcVar1 = pcVar8 + 1;
  if (pcVar5[1] != ':') {
LAB_0010752e:
    ps->nextchar = pcVar1;
    return (int)*pcVar8;
  }
  if (*pcVar1 == '\0') {
    if (pcVar5[2] == ':') goto LAB_0010752e;
    iVar3 = ps->optind;
    if ((argc <= iVar3) || (pcVar2 = argv[iVar3], pcVar2 == (char *)0x0)) {
      ps->nextchar = pcVar1;
      ps->optopt = (int)*pcVar8;
LAB_0010763f:
      return (uint)(*optstring != ':') * 5 + 0x3a;
    }
    ps->optind = iVar3 + 1;
    ps->optarg = pcVar2;
  }
  else {
    ps->optarg = pcVar1;
  }
  ps->nextchar = (char *)0x0;
  return (int)*pcVar5;
}

Assistant:

int
parg_getopt_long(struct parg_state *ps, int argc, char *const argv[],
                 const char *optstring,
                 const struct parg_option *longopts, int *longindex)
{
	assert(ps != NULL);
	assert(argv != NULL);
	assert(optstring != NULL);

	ps->optarg = NULL;

	if (argc < 2) {
		return -1;
	}

	/* Advance to next element if needed */
	if (ps->nextchar == NULL || *ps->nextchar == '\0') {
		if (is_argv_end(ps, argc, argv)) {
			return -1;
		}

		ps->nextchar = argv[ps->optind++];

		/* Check for nonoption element (including '-') */
		if (ps->nextchar[0] != '-' || ps->nextchar[1] == '\0') {
			ps->optarg = ps->nextchar;
			ps->nextchar = NULL;
			return 1;
		}

		/* Check for '--' */
		if (ps->nextchar[1] == '-') {
			if (ps->nextchar[2] == '\0') {
				ps->nextchar = NULL;
				return -1;
			}

			if (longopts != NULL) {
				ps->nextchar += 2;

				return match_long(ps, argc, argv, optstring,
				                  longopts, longindex);
			}
		}

		ps->nextchar++;
	}

	/* Match nextchar */
	return match_short(ps, argc, argv, optstring);
}